

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

bool pybind11::detail::raise_err(PyObject *exc_type,char *msg)

{
  long lVar1;
  handle local_28;
  char *local_20;
  char *msg_local;
  PyObject *exc_type_local;
  
  local_20 = msg;
  msg_local = (char *)exc_type;
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    handle::handle<_object_*,_0>(&local_28,(_object *)msg_local);
    set_error(&local_28,local_20);
  }
  else {
    raise_from((PyObject *)msg_local,local_20);
  }
  exc_type_local._7_1_ = lVar1 != 0;
  return exc_type_local._7_1_;
}

Assistant:

inline bool raise_err(PyObject *exc_type, const char *msg) {
    if (PyErr_Occurred()) {
        raise_from(exc_type, msg);
        return true;
    }
    set_error(exc_type, msg);
    return false;
}